

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

uint32_t avx::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  uint in_ECX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  uint32_t output [8];
  uint8_t *imageXEnd;
  uint8_t *imageX;
  simd sumLoHi;
  simd dataHi;
  simd dataLo;
  simd data;
  simd *srcEnd;
  simd *src;
  simd zero;
  simd simdSum;
  uint32_t sum;
  int local_3d0;
  int iStack_3cc;
  int iStack_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int iStack_3b8;
  int iStack_3b4;
  byte *local_3b0;
  byte *local_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 (*local_310) [32];
  undefined1 (*local_308) [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  int local_2b0;
  undefined1 (*local_298) [32];
  undefined1 (*local_288) [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_2b0 = 0;
  local_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  local_2e0 = ZEXT1632(ZEXT816(0));
  local_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  local_300 = ZEXT1632(ZEXT816(0));
  for (local_298 = in_RSI; local_298 != in_RDX;
      local_298 = (undefined1 (*) [32])(*local_298 + in_EDI)) {
    local_310 = local_298 + in_ECX;
    for (local_308 = local_298; local_308 != local_310; local_308 = local_308 + 1) {
      local_288 = local_308;
      local_340 = *(undefined8 *)*local_308;
      uStack_338 = *(undefined8 *)(*local_308 + 8);
      uStack_330 = *(undefined8 *)(*local_308 + 0x10);
      uStack_328 = *(undefined8 *)(*local_308 + 0x18);
      local_200 = 0;
      uStack_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      local_360 = vpunpcklbw_avx2(*local_308,ZEXT1632(ZEXT816(0)));
      local_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      uStack_1a8 = 0;
      local_380 = vpunpckhbw_avx2(*local_308,ZEXT1632(ZEXT816(0)));
      local_60 = local_360._0_8_;
      uStack_58 = local_360._8_8_;
      uStack_50 = local_360._16_8_;
      uStack_48 = local_360._24_8_;
      local_80 = local_380._0_8_;
      uStack_78 = local_380._8_8_;
      uStack_70 = local_380._16_8_;
      uStack_68 = local_380._24_8_;
      local_3a0 = vpaddw_avx2(local_360,local_380);
      local_e0 = local_2e0._0_8_;
      uStack_d8 = local_2e0._8_8_;
      uStack_d0 = local_2e0._16_8_;
      uStack_c8 = local_2e0._24_8_;
      local_160 = local_3a0._0_8_;
      uStack_158 = local_3a0._8_8_;
      uStack_150 = local_3a0._16_8_;
      uStack_148 = local_3a0._24_8_;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_a0 = vpunpcklwd_avx2(local_3a0,ZEXT832(0));
      local_120 = local_3a0._0_8_;
      uStack_118 = local_3a0._8_8_;
      uStack_110 = local_3a0._16_8_;
      uStack_108 = local_3a0._24_8_;
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      local_c0 = vpunpckhwd_avx2(local_3a0,ZEXT1632(ZEXT816(0)));
      local_100 = vpaddd_avx2(local_a0,local_c0);
      local_2e0 = vpaddd_avx2(local_2e0,local_100);
      local_1e0 = local_340;
      uStack_1d8 = uStack_338;
      uStack_1d0 = uStack_330;
      uStack_1c8 = uStack_328;
      local_1a0 = local_340;
      uStack_198 = uStack_338;
      uStack_190 = uStack_330;
      uStack_188 = uStack_328;
    }
    if (in_R9D != 0) {
      local_3a8 = *local_298 + in_R8D;
      local_3b0 = local_3a8 + in_R9D;
      for (; local_3a8 != local_3b0; local_3a8 = local_3a8 + 1) {
        local_2b0 = (uint)*local_3a8 + local_2b0;
      }
    }
  }
  memset(&local_3d0,0,0x20);
  iStack_3cc = local_2e0._4_4_;
  local_3d0 = local_2e0._0_4_;
  iStack_3c4 = local_2e0._12_4_;
  iStack_3c8 = local_2e0._8_4_;
  iStack_3bc = local_2e0._20_4_;
  iStack_3c0 = local_2e0._16_4_;
  iStack_3b4 = local_2e0._28_4_;
  iStack_3b8 = local_2e0._24_4_;
  return local_2b0 + local_3d0 + iStack_3cc + iStack_3c8 + iStack_3c4 + iStack_3c0 + iStack_3bc +
         iStack_3b8 + iStack_3b4;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY,const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm256_setzero_si256();
        simd zero    = _mm256_setzero_si256();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm256_loadu_si256( src );

                simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                       _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[8] ={ 0 };

        _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
    }